

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

bool __thiscall
flatbuffers::go::GoGenerator::NamespacePtrLess::operator()
          (NamespacePtrLess *this,Definition *a,Definition *b)

{
  bool bVar1;
  Definition *b_local;
  Definition *a_local;
  NamespacePtrLess *this_local;
  
  bVar1 = flatbuffers::operator<(a->defined_namespace,b->defined_namespace);
  return bVar1;
}

Assistant:

bool operator()(const Definition *a, const Definition *b) const {
      return *a->defined_namespace < *b->defined_namespace;
    }